

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::DragBehavior(ImRect *frame_bb,ImGuiID id,float *v,float v_speed,float v_min,float v_max,
                        int decimal_precision,float power)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ImU32 fill_col;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ImVec4 local_38;
  
  pIVar4 = GImGui;
  iVar5 = 9;
  if (GImGui->ActiveId != id) {
    iVar5 = (GImGui->HoveredId == id) + 7;
  }
  puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar5 << 4));
  local_38._0_8_ = *puVar1;
  uVar2 = puVar1[1];
  local_38.w = (float)((ulong)uVar2 >> 0x20);
  local_38.z = (float)uVar2;
  local_38.w = (GImGui->Style).Alpha * local_38.w;
  fill_col = ColorConvertFloat4ToU32(&local_38);
  RenderFrame(frame_bb->Min,frame_bb->Max,fill_col,true,(pIVar4->Style).FrameRounding);
  pIVar3 = GImGui;
  if (pIVar4->ActiveId == id) {
    if ((pIVar4->IO).MouseDown[0] == true) {
      if (pIVar4->ActiveIdIsJustActivated == true) {
        pIVar4->DragCurrentValue = *v;
        (pIVar4->DragLastMouseDelta).x = 0.0;
        (pIVar4->DragLastMouseDelta).y = 0.0;
      }
      fVar10 = 0.0;
      if (((GImGui->IO).MouseDown[0] == true) && (1.0 <= (GImGui->IO).MouseDragMaxDistanceSqr[0])) {
        fVar10 = (GImGui->IO).MousePos.x - (GImGui->IO).MouseClickedPos[0].x;
      }
      fVar6 = pIVar4->DragCurrentValue;
      fVar9 = (pIVar4->DragLastMouseDelta).x;
      if (fVar10 != fVar9) {
        if ((v_speed == 0.0) && (!NAN(v_speed))) {
          fVar8 = v_max - v_min;
          if (((fVar8 != 0.0) || (NAN(fVar8))) && (fVar8 < 3.4028235e+38)) {
            v_speed = fVar8 * pIVar4->DragSpeedDefaultRatio;
          }
        }
        if (((pIVar4->IO).KeyShift == true) && (0.0 <= pIVar4->DragSpeedScaleFast)) {
          v_speed = v_speed * pIVar4->DragSpeedScaleFast;
        }
        if (((pIVar4->IO).KeyAlt == true) && (0.0 <= pIVar4->DragSpeedScaleSlow)) {
          v_speed = v_speed * pIVar4->DragSpeedScaleSlow;
        }
        fVar9 = (fVar10 - fVar9) * v_speed;
        if (ABS(power + -1.0) <= 0.001) {
          fVar6 = fVar6 + fVar9;
        }
        else {
          fVar7 = -fVar6;
          fVar8 = fVar6;
          if (fVar7 > fVar6) {
            fVar8 = fVar7;
          }
          fVar7 = *(float *)(&DAT_00195788 + (ulong)(fVar7 <= fVar6) * 4);
          fVar8 = powf(fVar8,1.0 / power);
          fVar8 = fVar9 * fVar7 + fVar8;
          fVar9 = -fVar8;
          fVar6 = powf((float)(~-(uint)(fVar9 <= fVar8) & (uint)fVar9 |
                              -(uint)(fVar9 <= fVar8) & (uint)fVar8),power);
          fVar6 = fVar6 * fVar7;
          if (fVar8 < fVar9) {
            fVar6 = -fVar6;
          }
        }
        (pIVar4->DragLastMouseDelta).x = fVar10;
        if (v_min < v_max) {
          if (fVar6 <= v_max) {
            v_max = fVar6;
          }
          fVar6 = (float)(-(uint)(fVar6 < v_min) & (uint)v_min |
                         ~-(uint)(fVar6 < v_min) & (uint)v_max);
        }
        pIVar4->DragCurrentValue = fVar6;
      }
      fVar6 = RoundScalar(fVar6,decimal_precision);
      fVar10 = *v;
      if ((fVar10 == fVar6) && (!NAN(fVar10) && !NAN(fVar6))) {
        return (bool)(-(fVar6 != fVar10) & 1);
      }
      *v = fVar6;
      return true;
    }
    GImGui->ActiveId = 0;
    pIVar3->ActiveIdIsJustActivated = true;
    pIVar3->ActiveIdAllowOverlap = false;
    pIVar3->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  return false;
}

Assistant:

bool ImGui::DragBehavior(const ImRect& frame_bb, ImGuiID id, float* v, float v_speed, float v_min, float v_max, int decimal_precision, float power)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, style.FrameRounding);

    bool value_changed = false;

    // Process clicking on the drag
    if (g.ActiveId == id)
    {
        if (g.IO.MouseDown[0])
        {
            if (g.ActiveIdIsJustActivated)
            {
                // Lock current value on click
                g.DragCurrentValue = *v;
                g.DragLastMouseDelta = ImVec2(0.f, 0.f);
            }

            float v_cur = g.DragCurrentValue;
            const ImVec2 mouse_drag_delta = GetMouseDragDelta(0, 1.0f);
            if (fabsf(mouse_drag_delta.x - g.DragLastMouseDelta.x) > 0.0f)
            {
                float speed = v_speed;
                if (speed == 0.0f && (v_max - v_min) != 0.0f && (v_max - v_min) < FLT_MAX)
                    speed = (v_max - v_min) * g.DragSpeedDefaultRatio;
                if (g.IO.KeyShift && g.DragSpeedScaleFast >= 0.0f)
                    speed = speed * g.DragSpeedScaleFast;
                if (g.IO.KeyAlt && g.DragSpeedScaleSlow >= 0.0f)
                    speed = speed * g.DragSpeedScaleSlow;

                float delta = (mouse_drag_delta.x - g.DragLastMouseDelta.x) * speed;
                if (fabsf(power - 1.0f) > 0.001f)
                {
                    // Logarithmic curve on both side of 0.0
                    float v0_abs = v_cur >= 0.0f ? v_cur : -v_cur;
                    float v0_sign = v_cur >= 0.0f ? 1.0f : -1.0f;
                    float v1 = powf(v0_abs, 1.0f / power) + (delta * v0_sign);
                    float v1_abs = v1 >= 0.0f ? v1 : -v1;
                    float v1_sign = v1 >= 0.0f ? 1.0f : -1.0f;          // Crossed sign line
                    v_cur = powf(v1_abs, power) * v0_sign * v1_sign;    // Reapply sign
                }
                else
                {
                    v_cur += delta;
                }
                g.DragLastMouseDelta.x = mouse_drag_delta.x;

                // Clamp
                if (v_min < v_max)
                    v_cur = ImClamp(v_cur, v_min, v_max);
                g.DragCurrentValue = v_cur;
            }

            // Round to user desired precision, then apply
            v_cur = RoundScalar(v_cur, decimal_precision);
            if (*v != v_cur)
            {
                *v = v_cur;
                value_changed = true;
            }
        }
        else
        {
            SetActiveID(0);
        }
    }

    return value_changed;
}